

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O3

void __thiscall cppcms::session_interface::validate_request_origin(session_interface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  level_type lVar6;
  request *prVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  runtime_error *this_01;
  ostream *poVar9;
  request_forgery_error *this_02;
  long lVar10;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar11;
  string token;
  string local_e0;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  if (this->context_ == (context *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"request origin validation isn\'t possible without http::context"
               ,"");
    booster::runtime_error::runtime_error(this_01,&local_e0);
    *(undefined ***)this_01 = &PTR__runtime_error_00284840;
    (this_01->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  uVar2 = *(uint *)&this->field_0x80;
  if ((uVar2 & 0x20) != 0) {
    return;
  }
  *(uint *)&this->field_0x80 = uVar2 | 0x20;
  if ((~uVar2 & 0xc0) != 0) {
    return;
  }
  prVar7 = http::context::request(this->context_);
  http::request::request_method_abi_cxx11_(&local_e0,prVar7);
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (iVar5 != 0) {
    return;
  }
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  prVar7 = http::context::request(this->context_);
  this_00 = &http::request::post_abi_cxx11_(prVar7)->_M_t;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"_csrf","");
  pVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range(this_00,&local_e0);
  _Var8 = pVar11.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (_Var8._M_node != pVar11.second._M_node._M_node) {
    lVar10 = 1;
    do {
      _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
      lVar10 = lVar10 + -1;
    } while (_Var8._M_node != pVar11.second._M_node._M_node);
    if (lVar10 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
      goto LAB_0020fcf8;
    }
  }
  prVar7 = http::context::request(this->context_);
  http::request::getenv_abi_cxx11_((request *)&local_e0,(char *)prVar7);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
LAB_0020fcf8:
  bVar3 = validate_csrf_token(this,&local_b0);
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    return;
  }
  lVar6 = booster::log::logger::instance();
  cVar4 = booster::log::logger::should_be_logged(lVar6,(char *)0x28);
  if (cVar4 != '\0') {
    booster::log::message::message
              ((message *)&local_e0,warning,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/session_interface.cpp"
               ,0x90);
    poVar9 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"CSRF validation failed",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," IP=",4);
    prVar7 = http::context::request(this->context_);
    http::request::remote_addr_abi_cxx11_(&local_50,prVar7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," SCRIPT_NAME=",0xd);
    prVar7 = http::context::request(this->context_);
    http::request::script_name_abi_cxx11_(&local_70,prVar7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," PATH_INFO=",0xb);
    prVar7 = http::context::request(this->context_);
    http::request::path_info_abi_cxx11_((string *)local_90,prVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_90._0_8_,local_90._8_8_)
    ;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    booster::log::message::~message((message *)&local_e0);
  }
  this_02 = (request_forgery_error *)__cxa_allocate_exception(0x30);
  request_forgery_error::request_forgery_error(this_02);
  __cxa_throw(this_02,&request_forgery_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void session_interface::validate_request_origin()
{
	if(!context_)
		throw cppcms_error("request origin validation isn't possible without http::context");
	if(csrf_checked_)
		return;
	csrf_checked_ = 1;

	if(!csrf_validation_)
		return;
	if(!csrf_do_validation_)
		return;
	if(context_->request().request_method()!="POST")
		return;
	
	std::string token;
	
	typedef http::request::form_type::const_iterator iterator_type;
	std::pair<iterator_type,iterator_type> pair=context_->request().post().equal_range("_csrf");

	if(pair.first != pair.second && std::distance(pair.first,pair.second)==1)
		token = pair.first->second;
	else
		token = context_->request().getenv("HTTP_X_CSRFTOKEN");
	
	if(!validate_csrf_token(token)) {
		BOOSTER_WARNING("cppcms")	<<"CSRF validation failed"
						<<" IP="<< context_->request().remote_addr() 
						<<" SCRIPT_NAME=" << context_->request().script_name() 
						<<" PATH_INFO="<<context_->request().path_info();  
		throw request_forgery_error();
	}
}